

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

StringRef llvm::sys::path::root_directory(StringRef path,Style style)

{
  StringRef *this;
  char cVar1;
  char cVar2;
  size_t sVar3;
  size_t sVar4;
  path *this_00;
  Style in_R8D;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  StringRef path_00;
  StringRef SVar8;
  const_iterator pos;
  const_iterator b;
  
  sVar4 = path.Length;
  this_00 = (path *)path.Data;
  path_00.Length._0_4_ = style;
  path_00.Data = (char *)sVar4;
  path_00.Length._4_4_ = 0;
  begin(&b,this_00,path_00,in_R8D);
  pos.Position = b.Position;
  pos.S = b.S;
  pos._44_4_ = b._44_4_;
  pos.Component.Data = b.Component.Data;
  pos.Component.Length = b.Component.Length;
  pos.Path.Data = b.Path.Data;
  pos.Path.Length = b.Path.Length;
  if ((path *)b.Path.Data == this_00) {
    sVar3 = 0;
    pcVar5 = (char *)0x0;
    if (b.Position == sVar4) goto LAB_0014af4c;
  }
  this = &b.Component;
  if ((b.Component.Length < 3) ||
     ((cVar1 = StringRef::operator[](this,0), cVar1 != '/' && (cVar1 != '\\' || style != windows))))
  {
    bVar6 = false;
  }
  else {
    cVar1 = StringRef::operator[](this,1);
    cVar2 = StringRef::operator[](this,0);
    bVar6 = cVar1 == cVar2;
  }
  if ((style == windows) && (b.Component.Length != 0)) {
    bVar7 = b.Component.Data[b.Component.Length - 1] == ':';
  }
  else {
    bVar7 = false;
  }
  if (((bool)(bVar7 | bVar6)) &&
     ((const_iterator::operator++(&pos), (path *)pos.Path.Data != this_00 || (pos.Position != sVar4)
      ))) {
    cVar1 = StringRef::operator[](&pos.Component,0);
    sVar3 = pos.Component.Length;
    pcVar5 = pos.Component.Data;
    if ((cVar1 == '/') || (style == windows && cVar1 == '\\')) goto LAB_0014af4c;
  }
  sVar3 = 0;
  pcVar5 = (char *)0x0;
  if (!bVar6) {
    cVar1 = StringRef::operator[](this,0);
    if ((cVar1 == '/') || (sVar3 = 0, pcVar5 = (char *)0x0, style == windows && cVar1 == '\\')) {
      sVar3 = b.Component.Length;
      pcVar5 = b.Component.Data;
    }
  }
LAB_0014af4c:
  SVar8.Length = sVar3;
  SVar8.Data = pcVar5;
  return SVar8;
}

Assistant:

StringRef root_directory(StringRef path, Style style) {
  const_iterator b = begin(path, style), pos = b, e = end(path);
  if (b != e) {
    bool has_net =
        b->size() > 2 && is_separator((*b)[0], style) && (*b)[1] == (*b)[0];
    bool has_drive = (real_style(style) == Style::windows) && b->endswith(":");

    if ((has_net || has_drive) &&
        // {C:,//net}, skip to the next component.
        (++pos != e) && is_separator((*pos)[0], style)) {
      return *pos;
    }

    // POSIX style root directory.
    if (!has_net && is_separator((*b)[0], style)) {
      return *b;
    }
  }

  // No path or no root.
  return StringRef();
}